

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int ConnectHokuyo(HOKUYO *pHokuyo,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char Sum;
  int Status;
  int ivalue;
  char line [256];
  char recvbuf [8192];
  undefined8 local_2028;
  undefined1 local_2020;
  undefined1 local_201f [8191];
  
  ivalue = 0;
  memset(pHokuyo->szCfgFilePath,0,0x100);
  sprintf(pHokuyo->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pHokuyo->szDevPath + 5,0,0xfb);
    builtin_strncpy(pHokuyo->szDevPath,"COM1",5);
    pHokuyo->BaudRate = 0x1c200;
    pHokuyo->timeout = 1000;
    pHokuyo->threadperiod = 100;
    pHokuyo->bSaveRawData = 1;
    pHokuyo->bForceSCIP20 = 0;
    pHokuyo->bHS = 0;
    pHokuyo->SlitDivision = 0x400;
    pHokuyo->StartingStep = 0x2c;
    pHokuyo->FrontStep = 0x180;
    pHokuyo->EndStep = 0x2d5;
    pHokuyo->ClusterCount = 0;
    pHokuyo->ScanInterval = 0;
    pHokuyo->bContinuousNumberOfScans = 1;
    pHokuyo->alpha_max_err = 0.01;
    pHokuyo->d_max_err = 0.1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pHokuyo->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->bForceSCIP20);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->bHS);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->SlitDivision);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->StartingStep);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->FrontStep);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->EndStep);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->ClusterCount);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->ScanInterval);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pHokuyo->bContinuousNumberOfScans);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pHokuyo->alpha_max_err);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pHokuyo->d_max_err);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0018ac22;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0018ac22:
  if (pHokuyo->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pHokuyo->threadperiod = 100;
  }
  iVar1 = pHokuyo->SlitDivision;
  if (iVar1 < 1) {
    puts("Invalid parameter : SlitDivision.");
    pHokuyo->SlitDivision = 0x400;
    iVar1 = 0x400;
  }
  iVar4 = pHokuyo->ClusterCount;
  if (iVar4 < 0) {
    puts("Invalid parameter : ClusterCount.");
    pHokuyo->ClusterCount = 0;
    iVar1 = pHokuyo->SlitDivision;
    iVar4 = 0;
  }
  pHokuyo->StepAngleSize = ((double)(iVar4 + 1) * 360.0) / (double)iVar1;
  pHokuyo->StepCount = ((pHokuyo->EndStep - pHokuyo->StartingStep) + 1) / (iVar4 + 1);
  iVar1 = OpenRS232Port(&pHokuyo->RS232Port,pHokuyo->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a Hokuyo.");
    return 1;
  }
  iVar1 = SetOptionsRS232Port(&pHokuyo->RS232Port,pHokuyo->BaudRate,'\0',0,'\b','\0',
                              pHokuyo->timeout);
  if (iVar1 == 0) {
    if (pHokuyo->bForceSCIP20 == 0) {
LAB_0018add2:
      memset(&local_2028,0,0x2000);
      local_2028 = CONCAT44(local_2028._4_4_,0xa5352);
      sVar3 = strlen((char *)&local_2028);
      iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2028,(int)sVar3);
      if (iVar1 == 0) {
        memset(recvbuf,0,0x2000);
        iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,8);
        if ((iVar1 == 0) && (iVar1 = bcmp(recvbuf,"RS\n00P\n\n",9), iVar1 == 0)) {
          memset(&local_2028,0,0x2000);
          local_2028 = CONCAT44(local_2028._4_4_,0xa4d42);
          sVar3 = strlen((char *)&local_2028);
          iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2028,(int)sVar3);
          if (iVar1 == 0) {
            memset(recvbuf,0,0x2000);
            iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,8);
            if ((iVar1 == 0) && (iVar1 = __isoc99_sscanf(recvbuf), iVar1 == 2)) {
              if (pHokuyo->bHS == 0) {
LAB_0018afbf:
                memset(&local_2028,0,0x2000);
                sprintf((char *)&local_2028,"MD%04d%04d%02d%01d00\n",
                        (ulong)(uint)pHokuyo->StartingStep,(ulong)(uint)pHokuyo->EndStep,
                        (ulong)(uint)pHokuyo->ClusterCount,(ulong)(uint)pHokuyo->ScanInterval);
                sVar3 = strlen((char *)&local_2028);
                iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2028,(int)sVar3);
                if (iVar1 == 0) {
                  memset(recvbuf,0,0x2000);
                  iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,0x15);
                  if (iVar1 == 0) {
                    ivalue = 0;
                    iVar1 = __isoc99_sscanf(recvbuf,"MD%04d%04d%02d%01d%02d\n00P\n\n",&ivalue,
                                            &ivalue,&ivalue,&ivalue,&ivalue);
                    if (iVar1 == 5) {
                      puts("Hokuyo connected.");
                      return 0;
                    }
                  }
                }
                pcVar2 = "Unable to connect to a Hokuyo : MD command failure.";
              }
              else {
                memset((void *)((long)&local_2028 + 5),0,0x1ffb);
                local_2028 = CONCAT35(local_2028._5_3_,0xa315348);
                sVar3 = strlen((char *)&local_2028);
                iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2028,(int)sVar3);
                if (iVar1 == 0) {
                  memset(recvbuf,0,0x2000);
                  iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,9);
                  if (iVar1 == 0) {
                    ivalue = 0;
                    iVar1 = __isoc99_sscanf(recvbuf);
                    if (iVar1 == 3) goto LAB_0018afbf;
                  }
                }
                pcVar2 = "Unable to connect to a Hokuyo : HS command failure.";
              }
              goto LAB_0018ad0e;
            }
          }
          pcVar2 = "Unable to connect to a Hokuyo : BM command failure.";
          goto LAB_0018ad0e;
        }
      }
      pcVar2 = "Unable to connect to a Hokuyo : RS command failure.";
      goto LAB_0018ad0e;
    }
    memset(local_201f,0,0x1ff7);
    local_2028 = 0xa302e3250494353;
    local_2020 = 0;
    sVar3 = strlen((char *)&local_2028);
    iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2028,(int)sVar3);
    if (iVar1 == 0) {
      memset(recvbuf,0,0x2000);
      iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,0xc);
      if ((iVar1 == 0) && (iVar1 = bcmp(recvbuf,"SCIP2.0\n00\n\n",0xd), iVar1 == 0))
      goto LAB_0018add2;
    }
  }
  pcVar2 = "Unable to connect to a Hokuyo.";
LAB_0018ad0e:
  puts(pcVar2);
  CloseRS232Port(&pHokuyo->RS232Port);
  return 1;
}

Assistant:

inline int ConnectHokuyo(HOKUYO* pHokuyo, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_HOKUYO];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_HOKUYO];
	int recvbuflen = 0;
	int ivalue = 0, Status = 0;
	char Sum = 0;

	memset(pHokuyo->szCfgFilePath, 0, sizeof(pHokuyo->szCfgFilePath));
	sprintf(pHokuyo->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pHokuyo->szDevPath, 0, sizeof(pHokuyo->szDevPath));
		sprintf(pHokuyo->szDevPath, "COM1");
		pHokuyo->BaudRate = 115200;
		pHokuyo->timeout = 1000;
		pHokuyo->threadperiod = 100;
		pHokuyo->bSaveRawData = 1;
		pHokuyo->bForceSCIP20 = 0;
		pHokuyo->bHS = 0;
		pHokuyo->SlitDivision = 1024;
		pHokuyo->StartingStep = 44;
		pHokuyo->FrontStep = 384;
		pHokuyo->EndStep = 725;
		pHokuyo->ClusterCount = 0;
		pHokuyo->ScanInterval = 0;
		pHokuyo->bContinuousNumberOfScans = 1;
		pHokuyo->alpha_max_err = 0.01;
		pHokuyo->d_max_err = 0.1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pHokuyo->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bForceSCIP20) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bHS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->SlitDivision) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->StartingStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->FrontStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->EndStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ClusterCount) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ScanInterval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bContinuousNumberOfScans) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pHokuyo->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pHokuyo->threadperiod = 100;
	}
	if (pHokuyo->SlitDivision <= 0)
	{
		printf("Invalid parameter : SlitDivision.\n");
		pHokuyo->SlitDivision = 1024;
	}
	if (pHokuyo->ClusterCount < 0)
	{
		printf("Invalid parameter : ClusterCount.\n");
		pHokuyo->ClusterCount = 0;
	}
		
	pHokuyo->StepAngleSize = 360.0*(pHokuyo->ClusterCount+1)/pHokuyo->SlitDivision;
	pHokuyo->StepCount = (pHokuyo->EndStep-pHokuyo->StartingStep+1)/(pHokuyo->ClusterCount+1);

	// Used to save raw data, should be handled specifically...
	//pHokuyo->pfSaveFile = NULL;

	if (OpenRS232Port(&pHokuyo->RS232Port, pHokuyo->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pHokuyo->RS232Port, pHokuyo->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pHokuyo->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	if (pHokuyo->bForceSCIP20)
	{	
		// Force SCIP2.0 mode.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "SCIP2.0\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 12;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		if (strcmp(recvbuf, "SCIP2.0\n00\n\n") != 0)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}
	
	// RS command to reset.
	
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "RS\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	if (strcmp(recvbuf, "RS\n00P\n\n") != 0)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// BM command to switch on the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "BM\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	Status = 0; Sum = 0;
	if ((sscanf(recvbuf, "BM\n%02d%c\n\n", &Status, &Sum) != 2)||((Status != 0)&&(Status != 2)))
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	if (pHokuyo->bHS)
	{
		// HS command to activate high sensitivity if available.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "HS1\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 9;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0; Status = 0; Sum = 0;
		if ((sscanf(recvbuf, "HS%01d\n%02d%c\n\n", &ivalue, &Status, &Sum) != 3)||((Status != 0)&&(Status != 2)))
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}

	// Other mode not yet handled...

	//if (pHokuyo->bContinuousNumberOfScans)
	{
		// MD command to start data acquisition.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "MD%04d%04d%02d%01d00\n", pHokuyo->StartingStep, pHokuyo->EndStep, pHokuyo->ClusterCount, pHokuyo->ScanInterval);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 21;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0;
		if (sscanf(recvbuf, "MD%04d%04d%02d%01d%02d\n00P\n\n", &ivalue, &ivalue, &ivalue, &ivalue, &ivalue) != 5)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// checking...
		// sscanf("echo...%02d%c\n\n", &Status, &Sum);
		// status == 0

	}
	
	printf("Hokuyo connected.\n");

	return EXIT_SUCCESS;
}